

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_adynarray.c
# Opt level: O1

void test_ADynArray_set_success_indexBeyondSize_bufferExpanded_fn(int _i)

{
  bool bVar1;
  int iVar2;
  char *pcVar3;
  char *expr;
  char *pcVar4;
  char **ppcVar5;
  char *pcVar6;
  char *pcVar7;
  char *pcVar8;
  char *pcStack_90;
  char *pcStack_88;
  char *pcStack_80;
  char *pcStack_78;
  char *pcStack_70;
  char *local_68;
  undefined8 uStack_60;
  char c;
  private_ACUtilsTest_ADynArray_CharArray array;
  
  array.buffer = (char *)0x0;
  array.reallocator._0_4_ = 0x10a480;
  array.reallocator._4_4_ = 0;
  array.deallocator._0_4_ = 0x10a4c0;
  array.deallocator._4_4_ = 0;
  array.size = 3;
  array.growStrategy = private_ACUtilsTest_ADynArray_growStrategy;
  array.capacity = 3;
  private_ACUtilsTest_ADynArray_reallocFail = 0;
  uStack_60 = 0x117ded;
  array.buffer = (char *)private_ACUtilsTest_ADynArray_realloc((void *)0x0,5);
  array.buffer[4] = '\0';
  builtin_strncpy(array.buffer,"012",4);
  private_ACUtilsTest_ADynArray_reallocCount = 0;
  c = '3';
  uStack_60 = 0x117e26;
  bVar1 = private_ACUtils_ADynArray_setRange(&array,3,1,&c,1);
  if (bVar1 == true) {
    uStack_60 = 0x117e40;
    _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
                ,0x689);
    if (array.size == 4) {
      uStack_60 = 0x117e60;
      _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
                  ,0x68a);
      if (array.capacity == 8) {
        uStack_60 = 0x117e80;
        _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
                    ,0x68b);
        if (array.buffer == (char *)0x0) {
          pcVar8 = "(void*) array.buffer != NULL";
          pcVar6 = "(void*) array.buffer";
          iVar2 = 0x68c;
LAB_00118038:
          uStack_60 = 0;
          local_68 = (char *)0x0;
          pcStack_70 = (char *)0x11803f;
          _ck_assert_failed("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
                            ,iVar2,"Assertion \'_ck_x != NULL\' failed",
                            "Assertion \'%s\' failed: %s == %#x",pcVar8,pcVar6);
        }
        uStack_60 = 0x117e9d;
        _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
                    ,0x68c);
        if (array.growStrategy == (ACUtilsGrowStrategy)0x0) {
          pcVar8 = "(void*) array.growStrategy != NULL";
          pcVar6 = "(void*) array.growStrategy";
          iVar2 = 0x68d;
          goto LAB_00118038;
        }
        uStack_60 = 0x117eba;
        _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
                    ,0x68d);
        pcVar4 = array.buffer;
        if (array.buffer == (char *)0x0) {
          pcVar8 = "";
          pcVar4 = "(null)";
        }
        else {
          uStack_60 = 0x117ed7;
          iVar2 = strcmp("0123",array.buffer);
          if (iVar2 == 0) {
            uStack_60 = 0x117ef0;
            _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
                        ,0x68e);
            if (private_ACUtilsTest_ADynArray_reallocCount == 1) {
              uStack_60 = 0x117f12;
              _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
                          ,0x68f);
              uStack_60 = 0x117f1b;
              (*(code *)CONCAT44(array.deallocator._4_4_,array.deallocator._0_4_))(array.buffer);
              return;
            }
            pcStack_70 = "1";
            pcVar6 = "private_ACUtilsTest_ADynArray_reallocCount == 1";
            pcVar7 = "private_ACUtilsTest_ADynArray_reallocCount";
            iVar2 = 0x68f;
            pcVar8 = (char *)private_ACUtilsTest_ADynArray_reallocCount;
            goto LAB_001180d3;
          }
          pcVar8 = "\"";
        }
        expr = 
        "Assertion \'(0 && (_ck_x == NULL) && (_ck_y == NULL)) || (0 && ((_ck_x == NULL) || (_ck_y == NULL)) && (_ck_x != _ck_y)) || ((_ck_x != NULL) && (_ck_y != NULL) && (0 == strcmp(_ck_y, _ck_x)))\' failed"
        ;
        pcVar3 = "Assertion \'%s\' failed: %s == %s%s%s, %s == %s%s%s";
        pcVar6 = "array.buffer == \"0123\"";
        pcVar7 = "array.buffer";
        iVar2 = 0x68e;
        local_68 = "\"";
        pcStack_70 = "0123";
        pcStack_78 = "\"";
        pcStack_80 = "\"0123\"";
        ppcVar5 = &pcStack_90;
        pcStack_90 = pcVar4;
        pcStack_88 = pcVar8;
        goto LAB_001180db;
      }
      pcStack_70 = "8";
      pcVar6 = "array.capacity == 8";
      pcVar7 = "array.capacity";
      iVar2 = 0x68b;
      local_68 = (char *)0x8;
      pcVar8 = (char *)array.capacity;
    }
    else {
      pcStack_70 = "4";
      pcVar6 = "array.size == 4";
      pcVar7 = "array.size";
      iVar2 = 0x68a;
      local_68 = (char *)0x4;
      pcVar8 = (char *)array.size;
    }
  }
  else {
    pcVar8 = (char *)(ulong)bVar1;
    pcStack_70 = "true";
    pcVar6 = 
    "private_ACUtils_ADynArray_setRange(&array, 3, 1, &(c), sizeof(*(&array)->buffer)) == true";
    pcVar7 = "private_ACUtils_ADynArray_setRange(&array, 3, 1, &(c), sizeof(*(&array)->buffer))";
    iVar2 = 0x689;
LAB_001180d3:
    local_68 = (char *)0x1;
  }
  expr = "Assertion \'_ck_x == _ck_y\' failed";
  pcVar3 = "Assertion \'%s\' failed: %s == %ju, %s == %ju";
  ppcVar5 = &pcStack_70;
LAB_001180db:
  uStack_60 = 0;
  *(char **)((long)ppcVar5 + -8) = pcVar8;
  *(code **)((long)ppcVar5 + -0x10) =
       test_ADynArray_set_failure_indexBeyondSize_bufferExpansionFailed_fn;
  _ck_assert_failed("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
                    ,iVar2,expr,pcVar3,pcVar6,pcVar7);
}

Assistant:

END_TEST
START_TEST(test_ADynArray_set_success_indexBeyondSize_bufferExpanded)
{
    struct private_ACUtilsTest_ADynArray_CharArray array = {.reallocator = private_ACUtilsTest_ADynArray_realloc, .deallocator = private_ACUtilsTest_ADynArray_free};
    array.size = 3;
    array.growStrategy = private_ACUtilsTest_ADynArray_growStrategy;
    array.capacity = 3;
    private_ACUtilsTest_ADynArray_reallocFail = false;
    array.buffer = (char*) array.reallocator(nullptr, array.capacity + 2);
    memcpy(array.buffer, "012\0\0", 5);
    private_ACUtilsTest_ADynArray_reallocCount = 0;
    char c = '3';
    ACUTILSTEST_ASSERT_UINT_EQ(ADynArray_set(&array, 3, c), true);
    ACUTILSTEST_ASSERT_UINT_EQ(array.size, 4);
    ACUTILSTEST_ASSERT_UINT_EQ(array.capacity, 8);
    ACUTILSTEST_ASSERT_PTR_NONNULL(array.buffer);
    ACUTILSTEST_ASSERT_PTR_NONNULL(array.growStrategy);
    ACUTILSTEST_ASSERT_STR_EQ(array.buffer, "0123");
    ACUTILSTEST_ASSERT_UINT_EQ(private_ACUtilsTest_ADynArray_reallocCount, 1);
    array.deallocator(array.buffer);
}